

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O0

GCfunc * lj_func_newL_gc(lua_State *L,GCproto *pt,GCfuncL *parent)

{
  byte bVar1;
  ushort uVar2;
  TValue *pTVar3;
  uint uVar4;
  GCfunc *pGVar5;
  GCupval *local_50;
  GCupval *uv;
  uint32_t v;
  TValue *base;
  MSize nuv;
  MSize i;
  GCRef *puv;
  GCfunc *fn;
  GCfuncL *parent_local;
  GCproto *pt_local;
  lua_State *L_local;
  
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step_fixtop(L);
  }
  pGVar5 = func_newL(L,pt,(GCtab *)(parent->env).gcptr64);
  bVar1 = pt->sizeuv;
  pTVar3 = L->base;
  for (base._4_4_ = 0; base._4_4_ < bVar1; base._4_4_ = base._4_4_ + 1) {
    uVar2 = *(ushort *)((pt->uv).ptr64 + (ulong)base._4_4_ * 2);
    uVar4 = (uint)uVar2;
    if ((uVar2 & 0x8000) == 0) {
      local_50 = (GCupval *)parent->uvptr[uVar4].gcptr64;
    }
    else {
      local_50 = func_finduv(L,pTVar3 + (uVar4 & 0xff));
      local_50->immutable = (byte)(uVar2 >> 0xe) & 1;
      local_50->dhash = (uint)(parent->pc).ptr64 ^ uVar4 << 0x18;
    }
    *(GCupval **)((long)pGVar5 + (ulong)base._4_4_ * 8 + 0x28) = local_50;
  }
  (pGVar5->c).nupvalues = bVar1;
  return pGVar5;
}

Assistant:

GCfunc *lj_func_newL_gc(lua_State *L, GCproto *pt, GCfuncL *parent)
{
  GCfunc *fn;
  GCRef *puv;
  MSize i, nuv;
  TValue *base;
  lj_gc_check_fixtop(L);
  fn = func_newL(L, pt, tabref(parent->env));
  /* NOBARRIER: The GCfunc is new (marked white). */
  puv = parent->uvptr;
  nuv = pt->sizeuv;
  base = L->base;
  for (i = 0; i < nuv; i++) {
    uint32_t v = proto_uv(pt)[i];
    GCupval *uv;
    if ((v & PROTO_UV_LOCAL)) {
      uv = func_finduv(L, base + (v & 0xff));
      uv->immutable = ((v / PROTO_UV_IMMUTABLE) & 1);
      uv->dhash = (uint32_t)(uintptr_t)mref(parent->pc, char) ^ (v << 24);
    } else {
      uv = &gcref(puv[v])->uv;
    }
    setgcref(fn->l.uvptr[i], obj2gco(uv));
  }
  fn->l.nupvalues = (uint8_t)nuv;
  return fn;
}